

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

shared_ptr<aeron::ExclusivePublication> __thiscall
aeron::archive::AeronArchive::addRecordedExclusivePublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int32_t in_ECX;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<aeron::ExclusivePublication> sVar4;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,streamId);
  ClientConductor::addExclusivePublication
            ((ClientConductor *)(channel[9]._M_string_length + 0x24b0),(string *)local_38,in_ECX);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->ctx_).cfg_.controlChannel._M_dataplus._M_p;
  while( true ) {
    ClientConductor::findExclusivePublication
              ((ClientConductor *)local_58,channel[9]._M_string_length + 0x24b0);
    uVar2 = local_58._8_8_;
    uVar1 = local_58._0_8_;
    local_58._0_8_ = (_func_int **)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if ((_func_int **)uVar1 != (_func_int **)0x0) break;
    sched_yield();
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  }
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)uVar2;
  (this->ctx_).cfg_.messageTimeoutNs = uVar1;
  ChannelUri::addSessionId((string *)local_58,(string *)local_38,*(int32_t *)(uVar1 + 0x54));
  startRecording((AeronArchive *)channel,(string *)local_58,in_ECX,LOCAL);
  _Var3._M_pi = extraout_RDX;
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::ExclusivePublication>)
         sVar4.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::ExclusivePublication> AeronArchive::addRecordedExclusivePublication(const std::string& channel,
                                                                                           std::int32_t streamId) {
    std::int64_t pubId = aeron_->addExclusivePublication(channel, streamId);
    std::shared_ptr<aeron::ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}